

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

char * duplicate_as_str(void *src,size_t len)

{
  char *dst;
  size_t len_local;
  void *src_local;
  
  src_local = malloc(len + 1);
  if (src_local == (void *)0x0) {
    src_local = (void *)0x0;
  }
  else {
    memcpy(src_local,src,len);
    *(undefined1 *)((long)src_local + len) = 0;
  }
  return (char *)src_local;
}

Assistant:

static char *duplicate_as_str(const void *src, size_t len)
{
    char *dst;

    if ((dst = malloc(len + 1)) == NULL)
        return NULL;
    memcpy(dst, src, len);
    dst[len] = '\0';
    return dst;
}